

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayCloseFailureContainsCorrectDetails::
~TestCheckArrayCloseFailureContainsCorrectDetails
          (TestCheckArrayCloseFailureContainsCorrectDetails *this)

{
  TestCheckArrayCloseFailureContainsCorrectDetails *this_local;
  
  ~TestCheckArrayCloseFailureContainsCorrectDetails(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArrayCloseFailureContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("arrayCloseTest", "arrayCloseSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		int const data1[4] = { 0, 1, 2, 3 };
        int const data2[4] = { 0, 1, 3, 3 };
        CHECK_ARRAY_CLOSE (data1, data2, 4, 0.01f);     line = __LINE__;
    }

    CHECK_EQUAL("arrayCloseTest", reporter.lastFailedTest);
    CHECK_EQUAL("arrayCloseSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}